

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_conflict sexp_twos_complement(sexp_conflict ctx,sexp_conflict x)

{
  sexp_conflict in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_conflict *local_30;
  undefined8 local_28;
  sexp_conflict local_20;
  sexp_conflict local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_20 = (sexp_conflict)0x43e;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_30,0,0x10);
  if (((((ulong)local_18 & 3) == 0) && (local_18->tag == 0xc)) &&
     ((local_18->value).flonum_bits[0] < '\0')) {
    local_30 = &local_20;
    local_28 = *(undefined8 *)(local_10 + 0x6080);
    *(sexp_conflict ***)(local_10 + 0x6080) = &local_30;
    local_20 = (sexp_conflict)sexp_copy_bignum(local_10,0,local_18);
    sexp_set_twos_complement(local_20);
    *(undefined8 *)(local_10 + 0x6080) = local_28;
    local_8 = local_20;
  }
  else {
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

static sexp sexp_twos_complement (sexp ctx, sexp x) {
  sexp_gc_var1(res);
  if (sexp_bignump(x) && sexp_bignum_sign(x) < 0) {
    sexp_gc_preserve1(ctx, res);
    res = sexp_copy_bignum(ctx, NULL, x, 0);
    sexp_set_twos_complement(res);
    sexp_gc_release1(ctx);
    return res;
  }
  return x;
}